

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O3

void other(void)

{
  char *__dest;
  LogStream *pLVar1;
  int iVar2;
  int iVar3;
  char **ppcVar4;
  Logger local_1018;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----------other test-----------",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  tt::Logger::Logger(&local_1018,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/tests/LoggingTest.cpp"
                     ,0x49);
  iVar2 = (int)&local_1018 + 0xfa8;
  iVar3 = iVar2 - (int)local_1018.m_impl.m_stream.m_buffer.m_cur;
  if (5 < iVar3) {
    builtin_strncpy(local_1018.m_impl.m_stream.m_buffer.m_cur,"fddsa",5);
    local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 5;
    iVar3 = iVar2 - (int)local_1018.m_impl.m_stream.m_buffer.m_cur;
  }
  if (1 < iVar3) {
    *local_1018.m_impl.m_stream.m_buffer.m_cur = 'c';
    local_1018.m_impl.m_stream.m_buffer.m_cur = local_1018.m_impl.m_stream.m_buffer.m_cur + 1;
  }
  pLVar1 = tt::LogStream::operator<<((LogStream *)&local_1018,0);
  pLVar1 = tt::LogStream::operator<<(pLVar1,3.666);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"This is a string","");
  ppcVar4 = &(pLVar1->m_buffer).m_cur;
  __dest = (pLVar1->m_buffer).m_cur;
  if ((int)local_38 < (int)ppcVar4 - (int)__dest) {
    memcpy(__dest,local_40,local_38);
    *ppcVar4 = *ppcVar4 + local_38;
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  tt::Logger::~Logger(&local_1018);
  return;
}

Assistant:

void other()
{
    // 1 line
    cout << "----------other test-----------" << endl;
    LOG << "fddsa" << 'c' << 0 << 3.666 << string("This is a string");
}